

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O2

int UpnpSubscribeAsync(UpnpClient_Handle Hnd,char *EvtUrl_const,int TimeOut,Upnp_FunPtr Fun,
                      void *Cookie_const)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  void *arg;
  Handle_Info **HndInfo;
  char *file;
  Handle_Info *local_70;
  ThreadPoolJob job;
  
  job.requestTime.tv_usec = 0;
  job.priority = LOW_PRIORITY;
  job.jobId = 0;
  job.free_func = (free_routine)0x0;
  job.requestTime.tv_sec = 0;
  job.func = (start_routine)0x0;
  job.arg = (void *)0x0;
  if (UpnpSdkInit == 1) {
    iVar2 = 6;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x8a2,"Inside UpnpSubscribeAsync\n");
    HandleReadLock((char *)0x8a5,iVar2);
    HndInfo = &local_70;
    UVar1 = GetHandleInfo(Hnd,HndInfo);
    iVar2 = (int)HndInfo;
    if (UVar1 == HND_CLIENT) {
      if (EvtUrl_const == (char *)0x0) {
        file = (char *)0x8ae;
      }
      else if (TimeOut < 1 && TimeOut != -1) {
        file = (char *)0x8b2;
      }
      else {
        if (Fun != (Upnp_FunPtr)0x0) {
          HandleUnlock((char *)0x8b9,iVar2);
          arg = calloc(1,0x760);
          if (arg == (void *)0x0) {
            return -0x68;
          }
          *(UpnpClient_Handle *)((long)arg + 4) = Hnd;
          strncpy((char *)((long)arg + 0x60c),EvtUrl_const,0xff);
          *(int *)((long)arg + 8) = TimeOut;
          *(Upnp_FunPtr *)((long)arg + 0x740) = Fun;
          *(void **)((long)arg + 0x738) = Cookie_const;
          TPJobInit(&job,UpnpThreadDistribution,arg);
          TPJobSetFreeFunction(&job,free);
          TPJobSetPriority(&job,MED_PRIORITY);
          iVar2 = ThreadPoolAdd(&gSendThreadPool,&job,(int *)0x0);
          if (iVar2 != 0) {
            free(arg);
          }
          UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x8d3,"Exiting UpnpSubscribeAsync\n");
          return 0;
        }
        file = (char *)0x8b6;
      }
      HandleUnlock(file,iVar2);
      iVar2 = -0x65;
    }
    else {
      HandleUnlock((char *)0x8aa,iVar2);
      iVar2 = -100;
    }
  }
  else {
    iVar2 = -0x74;
  }
  return iVar2;
}

Assistant:

int UpnpSubscribeAsync(UpnpClient_Handle Hnd,
	const char *EvtUrl_const,
	int TimeOut,
	Upnp_FunPtr Fun,
	const void *Cookie_const)
{
	struct Handle_Info *SInfo = NULL;
	struct UpnpNonblockParam *Param;
	char *EvtUrl = (char *)EvtUrl_const;
	ThreadPoolJob job;

	memset(&job, 0, sizeof(job));

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpSubscribeAsync\n");

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_CLIENT:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	if (EvtUrl == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_PARAM;
	}
	if (TimeOut != UPNP_INFINITE && TimeOut < 1) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_PARAM;
	}
	if (Fun == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_PARAM;
	}
	HandleUnlock(__FILE__, __LINE__);

	Param = (struct UpnpNonblockParam *)malloc(
		sizeof(struct UpnpNonblockParam));
	if (Param == NULL) {
		return UPNP_E_OUTOF_MEMORY;
	}
	memset(Param, 0, sizeof(struct UpnpNonblockParam));

	Param->FunName = SUBSCRIBE;
	Param->Handle = Hnd;
	strncpy(Param->Url, EvtUrl, sizeof(Param->Url) - 1);
	Param->TimeOut = TimeOut;
	Param->Fun = Fun;
	Param->Cookie = (void *)Cookie_const;

	TPJobInit(&job, (start_routine)UpnpThreadDistribution, Param);
	TPJobSetFreeFunction(&job, (free_routine)free);
	TPJobSetPriority(&job, MED_PRIORITY);
	if (ThreadPoolAdd(&gSendThreadPool, &job, NULL) != 0) {
		free(Param);
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpSubscribeAsync\n");

	return UPNP_E_SUCCESS;
}